

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::ExactCompareDistance(Vector3_xf *x,Vector3_xf *y,ExactFloat *r2)

{
  int iVar1;
  int iVar2;
  ExactFloat local_108;
  ExactFloat local_f8;
  ExactFloat local_e8;
  ExactFloat local_d8;
  ExactFloat local_c8;
  ExactFloat local_b8;
  undefined1 local_a8 [8];
  ExactFloat cmp;
  int r_sign;
  int xy_sign;
  ExactFloat local_78 [2];
  ExactFloat local_58;
  undefined1 local_48 [8];
  ExactFloat cos_r;
  ExactFloat cos_xy;
  ExactFloat *r2_local;
  Vector3_xf *y_local;
  Vector3_xf *x_local;
  
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&cos_r.bn_,x);
  ExactFloat::ExactFloat(&local_58,1);
  ExactFloat::ExactFloat((ExactFloat *)&r_sign,0.5);
  ::operator*(local_78,(ExactFloat *)&r_sign);
  ::operator-((ExactFloat *)local_48,&local_58);
  ExactFloat::~ExactFloat(local_78);
  ExactFloat::~ExactFloat((ExactFloat *)&r_sign);
  ExactFloat::~ExactFloat(&local_58);
  iVar1 = ExactFloat::sgn((ExactFloat *)&cos_r.bn_);
  iVar2 = ExactFloat::sgn((ExactFloat *)local_48);
  if (iVar1 == iVar2) {
    ::operator*(&local_d8,(ExactFloat *)local_48);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_e8);
    ::operator*(&local_c8,&local_d8);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_f8);
    ::operator*(&local_b8,&local_c8);
    ::operator*(&local_108,(ExactFloat *)&cos_r.bn_);
    ::operator-((ExactFloat *)local_a8,&local_b8);
    ExactFloat::~ExactFloat(&local_108);
    ExactFloat::~ExactFloat(&local_b8);
    ExactFloat::~ExactFloat(&local_f8);
    ExactFloat::~ExactFloat(&local_c8);
    ExactFloat::~ExactFloat(&local_e8);
    ExactFloat::~ExactFloat(&local_d8);
    iVar2 = ExactFloat::sgn((ExactFloat *)local_a8);
    x_local._4_4_ = iVar1 * iVar2;
    cmp.bn_.bn_._4_4_ = 1;
    ExactFloat::~ExactFloat((ExactFloat *)local_a8);
  }
  else {
    x_local._4_4_ = 1;
    if (iVar2 < iVar1) {
      x_local._4_4_ = -1;
    }
    cmp.bn_.bn_._4_4_ = 1;
  }
  ExactFloat::~ExactFloat((ExactFloat *)local_48);
  ExactFloat::~ExactFloat((ExactFloat *)&cos_r.bn_);
  return x_local._4_4_;
}

Assistant:

int ExactCompareDistance(const Vector3_xf& x, const Vector3_xf& y,
                         const ExactFloat& r2) {
  // This code produces the same result as though all points were reprojected
  // to lie exactly on the surface of the unit sphere.  It is based on
  // comparing the cosine of the angle XY (when both points are projected to
  // lie exactly on the sphere) to the given threshold.
  ExactFloat cos_xy = x.DotProd(y);
  ExactFloat cos_r = 1 - 0.5 * r2;
  // If the two values have different signs, we need to handle that case now
  // before squaring them below.
  int xy_sign = cos_xy.sgn(), r_sign = cos_r.sgn();
  if (xy_sign != r_sign) {
    return (xy_sign > r_sign) ? -1 : 1;  // If cos(XY) > cos(r), then XY < r.
  }
  ExactFloat cmp = cos_r * cos_r * x.Norm2() * y.Norm2() - cos_xy * cos_xy;
  return xy_sign * cmp.sgn();
}